

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkMutableDescriptorTypeCreateInfoEXT *create_info,ScratchAllocator *alloc)

{
  VkMutableDescriptorTypeListEXT *pVVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  void *pvVar5;
  void *__dest;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  
  puVar4 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (puVar4 != (undefined8 *)0x0) {
    uVar3 = *(undefined8 *)create_info;
    pvVar5 = create_info->pNext;
    pVVar1 = create_info->pMutableDescriptorTypeLists;
    puVar4[2] = *(undefined8 *)&create_info->mutableDescriptorTypeListCount;
    puVar4[3] = pVVar1;
    *puVar4 = uVar3;
    puVar4[1] = pvVar5;
  }
  if (puVar4[3] != 0) {
    if ((ulong)create_info->mutableDescriptorTypeListCount == 0) {
      pvVar5 = (void *)0x0;
    }
    else {
      pVVar1 = create_info->pMutableDescriptorTypeLists;
      sVar9 = (ulong)create_info->mutableDescriptorTypeListCount << 4;
      pvVar5 = ScratchAllocator::allocate_raw(alloc,sVar9,0x10);
      if (pvVar5 == (void *)0x0) {
        pvVar5 = (void *)0x0;
      }
      else {
        memmove(pvVar5,pVVar1,sVar9);
      }
    }
    puVar4[3] = pvVar5;
  }
  uVar6 = *(uint *)(puVar4 + 2);
  if (uVar6 != 0) {
    lVar8 = 8;
    uVar7 = 0;
    do {
      lVar2 = puVar4[3];
      pvVar5 = *(void **)(lVar2 + lVar8);
      if (pvVar5 != (void *)0x0) {
        uVar10 = (ulong)*(uint *)(lVar2 + -8 + lVar8);
        if (uVar10 == 0) {
          __dest = (void *)0x0;
        }
        else {
          sVar9 = uVar10 << 2;
          __dest = ScratchAllocator::allocate_raw(alloc,sVar9,0x10);
          if (__dest == (void *)0x0) {
            __dest = (void *)0x0;
          }
          else {
            memmove(__dest,pvVar5,sVar9);
          }
        }
        *(void **)(lVar2 + lVar8) = __dest;
        uVar6 = *(uint *)(puVar4 + 2);
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar7 < uVar6);
  }
  return puVar4;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkMutableDescriptorTypeCreateInfoEXT *create_info,
                                             ScratchAllocator &alloc)
{
	auto *info = copy(create_info, 1, alloc);
	if (info->pMutableDescriptorTypeLists)
		info->pMutableDescriptorTypeLists = copy(create_info->pMutableDescriptorTypeLists, create_info->mutableDescriptorTypeListCount, alloc);

	for (uint32_t i = 0; i < info->mutableDescriptorTypeListCount; i++)
	{
		auto &l = const_cast<VkMutableDescriptorTypeListEXT &>(info->pMutableDescriptorTypeLists[i]);
		if (l.pDescriptorTypes)
			l.pDescriptorTypes = copy(l.pDescriptorTypes, l.descriptorTypeCount, alloc);
	}

	return info;
}